

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::BasicUsageFS::Cleanup(BasicUsageFS *this)

{
  int width;
  int height;
  BasicUsageFS *this_local;
  
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->fbo_);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,2,
             this->rt_);
  width = glcts::anon_unknown_0::SACSubcaseBase::getWindowWidth(&this->super_SACSubcaseBase);
  height = glcts::anon_unknown_0::SACSubcaseBase::getWindowHeight(&this->super_SACSubcaseBase);
  glu::CallLogWrapper::glViewport
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,
             0,width,height);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->counter_buffer_);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->vao_);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->vbo_);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->prog_);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0)
  ;
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteFramebuffers(1, &fbo_);
		glDeleteTextures(2, rt_);
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glDeleteBuffers(1, &counter_buffer_);
		glDeleteVertexArrays(1, &vao_);
		glDeleteBuffers(1, &vbo_);
		glDeleteProgram(prog_);
		glUseProgram(0);
		return NO_ERROR;
	}